

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQRex * sqstd_rex_compile(SQChar *pattern,SQChar **error)

{
  int iVar1;
  size_t sVar2;
  SQRexNode *pSVar3;
  SQInteger SVar4;
  void *pvVar5;
  SQChar *error_00;
  SQRexMatch *pSVar6;
  SQChar **in_RSI;
  SQRex *in_RDI;
  SQInteger res;
  SQRex *exp;
  SQRex *local_8;
  
  local_8 = (SQRex *)sq_malloc(0x150ff8);
  local_8->_bol = (SQChar *)0x0;
  local_8->_eol = (SQChar *)0x0;
  local_8->_p = (SQChar *)in_RDI;
  sVar2 = strlen((char *)in_RDI);
  local_8->_nallocated = sVar2;
  pSVar3 = (SQRexNode *)sq_malloc(0x151050);
  local_8->_nodes = pSVar3;
  local_8->_nsize = 0;
  local_8->_matches = (SQRexMatch *)0x0;
  local_8->_nsubexpr = 0;
  SVar4 = sqstd_rex_newnode((SQRex *)error,exp._4_4_);
  local_8->_first = SVar4;
  local_8->_error = in_RSI;
  pvVar5 = sq_malloc(0x1510b6);
  local_8->_jmpbuf = pvVar5;
  iVar1 = _setjmp((__jmp_buf_tag *)local_8->_jmpbuf);
  if (iVar1 == 0) {
    error_00 = (SQChar *)sqstd_rex_list(in_RDI);
    local_8->_nodes[local_8->_first].left = (SQInteger)error_00;
    if (*local_8->_p != '\0') {
      sqstd_rex_error(local_8,error_00);
    }
    pSVar6 = (SQRexMatch *)sq_malloc(0x15113c);
    local_8->_matches = pSVar6;
    memset(local_8->_matches,0,local_8->_nsubexpr << 4);
  }
  else {
    sqstd_rex_free((SQRex *)0x151171);
    local_8 = (SQRex *)0x0;
  }
  return local_8;
}

Assistant:

SQRex *sqstd_rex_compile(const SQChar *pattern,const SQChar **error)
{
    SQRex * volatile exp = (SQRex *)sq_malloc(sizeof(SQRex)); // "volatile" is needed for setjmp()
    exp->_eol = exp->_bol = NULL;
    exp->_p = pattern;
    exp->_nallocated = (SQInteger)scstrlen(pattern) * sizeof(SQChar);
    exp->_nodes = (SQRexNode *)sq_malloc(exp->_nallocated * sizeof(SQRexNode));
    exp->_nsize = 0;
    exp->_matches = 0;
    exp->_nsubexpr = 0;
    exp->_first = sqstd_rex_newnode(exp,OP_EXPR);
    exp->_error = error;
    exp->_jmpbuf = sq_malloc(sizeof(jmp_buf));
    if(setjmp(*((jmp_buf*)exp->_jmpbuf)) == 0) {
        SQInteger res = sqstd_rex_list(exp);
        exp->_nodes[exp->_first].left = res;
        if(*exp->_p!='\0')
            sqstd_rex_error(exp,_SC("unexpected character"));
#ifdef _DEBUG
        {
            SQInteger nsize,i;
            SQRexNode *t;
            nsize = exp->_nsize;
            t = &exp->_nodes[0];
            scprintf(_SC("\n"));
            for(i = 0;i < nsize; i++) {
                if(exp->_nodes[i].type>MAX_CHAR)
                    scprintf(_SC("[%02d] %10s "),i,g_nnames[exp->_nodes[i].type-MAX_CHAR]);
                else
                    scprintf(_SC("[%02d] %10c "),i,exp->_nodes[i].type);
                scprintf(_SC("left %02d right %02d next %02d\n"), (SQInt32)exp->_nodes[i].left, (SQInt32)exp->_nodes[i].right, (SQInt32)exp->_nodes[i].next);
            }
            scprintf(_SC("\n"));
        }
#endif
        exp->_matches = (SQRexMatch *) sq_malloc(exp->_nsubexpr * sizeof(SQRexMatch));
        memset(exp->_matches,0,exp->_nsubexpr * sizeof(SQRexMatch));
    }
    else{
        sqstd_rex_free(exp);
        return NULL;
    }
    return exp;
}